

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O0

int __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::vSolveRight4update
          (CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *eps,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *vec,int *idx,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *rhs,int *ridx,int rn,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *forest,int *forestNum,int *forestIdx)

{
  long lVar1;
  bool bVar2;
  long in_RDI;
  int *in_R9;
  int *unaff_retaddr;
  int in_stack_00000008;
  undefined4 in_stack_0000000c;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_00000010;
  int *in_stack_00000018;
  int *in_stack_00000020;
  int *rperm_1;
  int k_1;
  int j_1;
  int i_1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  x_1;
  int *it;
  int *rperm;
  int k;
  int j;
  int i;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  x;
  cpp_dec_float<50U,_int,_void> *in_stack_fffffffffffffc48;
  cpp_dec_float<50U,_int,_void> *f;
  cpp_dec_float<50U,_int,_void> *in_stack_fffffffffffffc50;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffcb8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffcc0;
  cpp_dec_float<50U,_int,_void> local_30c;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2d4 [2];
  long local_260;
  int local_258;
  int local_254;
  int local_250;
  int local_214 [17];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffe30;
  int in_stack_fffffffffffffe3c;
  int *in_stack_fffffffffffffe40;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffe48;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffe50;
  int *local_1a0;
  int local_188;
  int local_184;
  undefined1 local_180 [72];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffec8;
  int *in_stack_fffffffffffffed0;
  int *in_stack_fffffffffffffed8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffee0;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffee8;
  undefined1 *in_stack_ffffffffffffffe8;
  int iVar3;
  int *in_stack_fffffffffffffff0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffff8;
  
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
            (in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
  vSolveLright(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
               in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  if (in_stack_00000010 ==
      (CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       *)0x0) {
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
              (in_stack_fffffffffffffc50);
    local_260 = *(long *)(in_RDI + 0x130);
    local_254 = 0;
    for (local_250 = 0; iVar3 = (int)((ulong)in_stack_ffffffffffffffe8 >> 0x20),
        local_250 < in_stack_00000008; local_250 = local_250 + 1) {
      local_258 = in_R9[local_250];
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                (in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                (in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                (in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
      bVar2 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
      if (bVar2) {
        enQueueMax(in_R9,&local_254,*(int *)(local_260 + (long)local_258 * 4));
      }
      else {
        local_2d4[0].m_backend.data._M_elems[0] = 0;
        in_stack_fffffffffffffff8 = local_2d4;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                  (in_stack_fffffffffffffc50,(long_long_type)in_stack_fffffffffffffc48);
      }
    }
    in_stack_00000008 = local_254;
  }
  else {
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
              (in_stack_fffffffffffffc50);
    local_1a0 = in_stack_00000020;
    lVar1 = *(long *)(in_RDI + 0x130);
    local_188 = 0;
    for (local_184 = 0; iVar3 = (int)((ulong)in_stack_ffffffffffffffe8 >> 0x20),
        local_184 < in_stack_00000008; local_184 = local_184 + 1) {
      iVar3 = in_R9[local_184];
      in_stack_ffffffffffffffe8 = local_180;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                (in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                (in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                (in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
      bVar2 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
      if (bVar2) {
        *local_1a0 = iVar3;
        enQueueMax(in_R9,&local_188,*(int *)(lVar1 + (long)iVar3 * 4));
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                  (in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
        local_1a0 = local_1a0 + 1;
      }
      else {
        local_214[0] = 0;
        in_stack_fffffffffffffff0 = local_214;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                  (in_stack_fffffffffffffc50,(long_long_type)in_stack_fffffffffffffc48);
      }
    }
    in_stack_00000008 = local_188;
    *in_stack_00000018 = local_188;
  }
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
            (in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
  f = &local_30c;
  in_stack_00000008 =
       vSolveUright(in_stack_00000010,
                    (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)CONCAT44(in_stack_0000000c,in_stack_00000008),unaff_retaddr,
                    in_stack_fffffffffffffff8,in_stack_fffffffffffffff0,iVar3,rhs);
  if (*(int *)(in_RDI + 400) == 0) {
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
              (in_stack_fffffffffffffc50,f);
    in_stack_00000008 =
         vSolveUpdateRight(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,
                           in_stack_fffffffffffffe40,in_stack_fffffffffffffe3c,
                           in_stack_fffffffffffffe30);
  }
  return in_stack_00000008;
}

Assistant:

int CLUFactor<R>::vSolveRight4update(R eps,
                                     R* vec, int* idx,                       /* result */
                                     R* rhs, int* ridx, int rn,              /* rhs    */
                                     R* forest, int* forestNum, int* forestIdx)
{
   vSolveLright(rhs, ridx, rn, eps);
   assert(rn >= 0 && rn <= thedim);

   /*  turn index list into a heap
    */

   if(forest)
   {
      R x;
      int i, j, k;
      int* rperm;
      int* it = forestIdx;

      rperm = row.perm;

      for(i = j = 0; i < rn; ++i)
      {
         k = ridx[i];
         assert(k >= 0 && k < thedim);
         x = rhs[k];

         if(isNotZero(x, eps))
         {
            enQueueMax(ridx, &j, rperm[*it++ = k]);
            forest[k] = x;
         }
         else
            rhs[k] = 0;
      }

      *forestNum = rn = j;
   }
   else
   {
      R x;
      int i, j, k;
      int* rperm;

      rperm = row.perm;

      for(i = j = 0; i < rn; ++i)
      {
         k = ridx[i];
         assert(k >= 0 && k < thedim);
         x = rhs[k];

         if(isNotZero(x, eps))
            enQueueMax(ridx, &j, rperm[k]);
         else
            rhs[k] = 0;
      }

      rn = j;
   }

   rn = vSolveUright(vec, idx, rhs, ridx, rn, eps);

   if(!l.updateType)             /* no Forest-Tomlin Updates */
      rn = vSolveUpdateRight(vec, idx, rn, eps);

   return rn;
}